

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncRead<unsigned_short>
          (ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode mode;
  StringLiteral *args;
  unsigned_long local_2b0;
  ushort local_2a2;
  undefined1 auStack_2a0 [6];
  unsigned_short buffer;
  __mbstate_t local_298;
  undefined4 local_28c;
  undefined1 local_288 [8];
  ifstream file;
  path local_70;
  undefined1 local_50 [8];
  path fullName;
  int64_t pos;
  StringLiteral *fileName;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  fileName = (StringLiteral *)parameters;
  parameters_local = (vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)funcName;
  funcName_local = (Identifier *)__return_storage_ptr__;
  bVar1 = getExpFuncParameter(parameters,0,(StringLiteral **)&pos,funcName,false);
  if (!bVar1) {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  fullName._path.field_2._8_8_ = 0;
  args = (StringLiteral *)parameters_local;
  bVar1 = getExpFuncParameter((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)fileName,
                              1,(int64_t *)(fullName._path.field_2._M_local_buf + 8),
                              (Identifier *)parameters_local,true);
  if (bVar1) {
    StringLiteral::path(&local_70,(StringLiteral *)pos);
    getFullPathName((path *)local_50,&local_70);
    ghc::filesystem::path::~path(&local_70);
    mode = std::operator|(_S_in,_S_bin);
    ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_288,(path *)local_50,mode);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      Logger::queueError<StringLiteral>((Logger *)0x1,0x2207c5,(char *)pos,args);
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
    else {
      std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_2a0,fullName._path.field_2._8_8_);
      std::istream::seekg(local_288,_auStack_2a0,local_298);
      bVar2 = std::ios::eof();
      if (((bVar2 & 1) == 0) && (bVar2 = std::ios::fail(), (bVar2 & 1) == 0)) {
        std::istream::read(local_288,(long)&local_2a2);
        bVar2 = std::ios::fail();
        if ((bVar2 & 1) == 0) {
          ExpressionValue::ExpressionValue(__return_storage_ptr__,(ulong)local_2a2);
        }
        else {
          local_2b0 = 2;
          Logger::queueError<unsigned_long,long,StringLiteral>
                    (Error,"Failed to read %d byte(s) from offset 0x%08X of %s",&local_2b0,
                     (long *)(fullName._path.field_2._M_local_buf + 8),(StringLiteral *)pos);
          ExpressionValue::ExpressionValue(__return_storage_ptr__);
        }
      }
      else {
        Logger::queueError<long,StringLiteral>
                  (Error,"Invalid offset 0x%08X of %s",
                   (long *)(fullName._path.field_2._M_local_buf + 8),(StringLiteral *)pos);
        ExpressionValue::ExpressionValue(__return_storage_ptr__);
      }
    }
    local_28c = 1;
    ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_288);
    ghc::filesystem::path::~path((path *)local_50);
    return __return_storage_ptr__;
  }
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncRead(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	int64_t pos;

	GET_PARAM(parameters,0,fileName);
	GET_OPTIONAL_PARAM(parameters,1,pos,0);

	auto fullName = getFullPathName(fileName->path());

	fs::ifstream file(fullName, fs::ifstream::in | fs::ifstream::binary);
	if (!file.is_open())
	{
		Logger::queueError(Logger::Error, "Could not open %s",*fileName);
		return ExpressionValue();
	}

	file.seekg(pos);
	if (file.eof() || file.fail())
	{
		Logger::queueError(Logger::Error, "Invalid offset 0x%08X of %s", pos, *fileName);
		return ExpressionValue();
	}

	T buffer;
	file.read(reinterpret_cast<char*>(&buffer), sizeof(T));

	if (file.fail())
	{
		Logger::queueError(Logger::Error, "Failed to read %d byte(s) from offset 0x%08X of %s", sizeof(T), pos, *fileName);
		return ExpressionValue();
	}

	return ExpressionValue((int64_t) buffer);
}